

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O2

bool __thiscall CStorage::FindFileImpl(CStorage *this,int Type,CFindCBData *pCBData)

{
  char *pcVar1;
  int i;
  int Type_00;
  long in_FS_OFFSET;
  bool bVar2;
  char aBuf [512];
  char acStack_238 [520];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (pCBData->m_BufferSize < 1) {
    bVar2 = false;
  }
  else {
    *pCBData->m_pBuffer = '\0';
    if (Type == -1) {
      Type_00 = 0;
      do {
        if (this->m_NumPaths <= Type_00) goto LAB_001bd174;
        pcVar1 = GetPath(this,Type_00,pCBData->m_pPath,acStack_238,0x200);
        fs_listdir(pcVar1,FindFileCallback,Type_00,pCBData);
        Type_00 = Type_00 + 1;
      } while (*pCBData->m_pBuffer == '\0');
      bVar2 = true;
    }
    else {
      if ((-1 < Type) && (Type < this->m_NumPaths)) {
        pcVar1 = GetPath(this,Type,pCBData->m_pPath,acStack_238,0x200);
        fs_listdir(pcVar1,FindFileCallback,Type,pCBData);
      }
LAB_001bd174:
      bVar2 = *pCBData->m_pBuffer != '\0';
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool FindFileImpl(int Type, CFindCBData *pCBData)
	{
		if(pCBData->m_BufferSize < 1)
			return false;

		pCBData->m_pBuffer[0] = 0;

		char aBuf[IO_MAX_PATH_LENGTH];

		if(Type == TYPE_ALL)
		{
			// search within all available directories
			for(int i = 0; i < m_NumPaths; ++i)
			{
				fs_listdir(GetPath(i, pCBData->m_pPath, aBuf, sizeof(aBuf)), FindFileCallback, i, pCBData);
				if(pCBData->m_pBuffer[0])
					return true;
			}
		}
		else if(Type >= 0 && Type < m_NumPaths)
		{
			// search within wanted directory
			fs_listdir(GetPath(Type, pCBData->m_pPath, aBuf, sizeof(aBuf)), FindFileCallback, Type, pCBData);
		}

		return pCBData->m_pBuffer[0] != 0;
	}